

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_cpy_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  ggml_tensor *pgVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] == b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
    if ((inplace) || ((a->grad == (ggml_tensor *)0x0 && (b->grad == (ggml_tensor *)0x0)))) {
      pgVar1 = ggml_view_tensor(ctx,b);
      pgVar1->op = GGML_OP_CPY;
      pgVar1->grad = (ggml_tensor *)0x0;
      pgVar1->src0 = a;
      pgVar1->src1 = b;
      return pgVar1;
    }
    pcVar3 = "false";
    uVar2 = 0xe98;
  }
  else {
    pcVar3 = "ggml_nelements(a) == ggml_nelements(b)";
    uVar2 = 0xe93;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar2,
          pcVar3);
  abort();
}

Assistant:

struct ggml_tensor * ggml_cpy_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        bool inplace) {
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // make a view of the destination
    struct ggml_tensor * result = ggml_view_tensor(ctx, b);

    result->op   = GGML_OP_CPY;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}